

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyroot.c
# Opt level: O3

void CALCT(int *BOOL,int NN,double *SR,double *SI,double *HR,double *HI,double *QHR,double *QHI,
          double ARE,double INFINY,double *PVR,double *PVI,double *TR,double *TI)

{
  bool bVar1;
  ulong uVar2;
  double INFINY_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_28;
  double pvrt;
  double pvit;
  
  *QHR = *HR;
  pvit = *HI;
  *QHI = pvit;
  INFINY_00 = *QHR;
  if (2 < NN) {
    uVar2 = 1;
    do {
      dVar3 = INFINY_00 * *SI;
      INFINY_00 = (INFINY_00 * *SR - *SI * pvit) + HR[uVar2];
      pvit = pvit * *SR + dVar3 + HI[uVar2];
      QHR[uVar2] = INFINY_00;
      QHI[uVar2] = pvit;
      uVar2 = uVar2 + 1;
    } while (NN - 1 != uVar2);
  }
  dVar4 = ABS(INFINY_00);
  dVar3 = ABS(pvit);
  if (dVar3 <= dVar4) {
    if (dVar4 <= dVar3) {
      dVar3 = 1.4142135623730951;
    }
    else {
      dVar3 = SQRT((dVar3 / dVar4) * (dVar3 / dVar4) + 1.0);
    }
    dVar3 = dVar3 * dVar4;
  }
  else {
    dVar3 = SQRT((dVar4 / dVar3) * (dVar4 / dVar3) + 1.0) * dVar3;
  }
  dVar4 = ABS(HR[NN - 2U]);
  dVar5 = ABS(HI[NN - 2U]);
  if (dVar5 <= dVar4) {
    if (dVar4 <= dVar5) {
      dVar5 = 1.4142135623730951;
    }
    else {
      dVar5 = SQRT((dVar5 / dVar4) * (dVar5 / dVar4) + 1.0);
    }
    dVar5 = dVar5 * dVar4;
  }
  else {
    dVar5 = SQRT((dVar4 / dVar5) * (dVar4 / dVar5) + 1.0) * dVar5;
  }
  bVar1 = ARE * 10.0 * dVar5 < dVar3;
  *BOOL = (uint)!bVar1;
  local_28 = -*PVR;
  pvrt = -*PVI;
  if (bVar1) {
    CDIVID(&local_28,&pvrt,&pvit,TR,INFINY_00,TI,HI);
  }
  else {
    *TR = 0.0;
    *TI = 0.0;
  }
  return;
}

Assistant:

static void CALCT(int *BOOL, int NN, double *SR, double *SI, double *HR, double *HI,double *QHR, double *QHI,double ARE, double INFINY,double *PVR, double *PVI,double *TR, double *TI ) {
	/*
	C COMPUTES  T = -P(S)/H(S).
	C BOOL   - LOGICAL, SET TRUE IF H(S) IS ESSENTIALLY ZERO.
	*/
	double HVR, HVI, pvrt,pvit;
	int N;
	N = NN - 1;
	POLYEV(N, SR, SI, HR, HI, QHR, QHI, &HVR, &HVI);

	if (CMOD(&HVR, &HVI) <= ARE*10.0*CMOD(&HR[N - 1], &HI[N - 1])) {
		*BOOL = 1;
	}
	else {
		*BOOL = 0;
	}
	pvrt = -1.0 * *PVR;
	pvit = -1.0 * *PVI;
	if (*BOOL == 0) {
		CDIVID(&pvrt, &pvit, &HVR, &HVI, INFINY,TR, TI);
	}
	else {
		*TR = 0.0;
		*TI = 0.0;
	}

}